

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O2

VectorXd __thiscall
Tools::CalculateRMSE
          (Tools *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *estimations,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *ground_truth)

{
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar1;
  pointer pMVar2;
  ulong uVar3;
  ostream *poVar4;
  long *in_RCX;
  DenseIndex extraout_RDX;
  DenseIndex extraout_RDX_00;
  DenseIndex DVar5;
  uint uVar6;
  ulong uVar7;
  pointer pMVar8;
  VectorXd VVar9;
  Matrix<double,_1,1,0,_1,1> *local_70;
  Matrix<double,_1,1,0,_1,1> *local_68;
  VectorXd residual;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_50;
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this,4);
  local_50.m_row = 0;
  local_50.m_col = 1;
  local_50.m_currentBlockRows = 1;
  *this->_vptr_Tools = (_func_int *)0x0;
  residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_50.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_50,(Scalar *)&residual);
  local_68 = (Matrix<double,_1,1,0,_1,1> *)0x0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,(Scalar *)&local_68);
  local_70 = (Matrix<double,_1,1,0,_1,1> *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar1,(Scalar *)&local_70);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_50);
  pMVar8 = (ground_truth->
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (ground_truth->
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((pMVar2 == pMVar8) || ((long)pMVar2 - (long)pMVar8 != in_RCX[1] - *in_RCX)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid estimation or ground_truth data");
    std::endl<char,std::char_traits<char>>(poVar4);
    DVar5 = extraout_RDX;
  }
  else {
    uVar6 = 0;
    while( true ) {
      uVar7 = (ulong)uVar6;
      uVar3 = (long)pMVar2 - (long)pMVar8 >> 4;
      if (uVar3 <= uVar7) break;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&local_50,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)(pMVar8 + uVar7),
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(uVar7 * 0x10 + *in_RCX));
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&residual,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_50);
      local_70 = (Matrix<double,_1,1,0,_1,1> *)&residual;
      local_68 = (Matrix<double,_1,1,0,_1,1> *)&residual;
      Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_50,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_68,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                 &local_70);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&residual,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_50);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&residual);
      free(residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      uVar6 = uVar6 + 1;
      pMVar8 = (ground_truth->
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pMVar2 = (ground_truth->
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_50.m_row = (Index)(double)(long)uVar3;
    local_50.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    lazyAssign<Eigen::CwiseUnaryOp<Eigen::internal::scalar_quotient1_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_quotient1_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_50);
    local_50.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&local_50);
    DVar5 = extraout_RDX_00;
  }
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar5;
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd Tools::CalculateRMSE(const vector<VectorXd> &estimations,
                              const vector<VectorXd> &ground_truth) {
  /**
  TODO:
    * Calculate the RMSE here.
  */
  VectorXd rmse(4);
  rmse << 0,0,0,0;
  // check the validity of the following inputs:
  //  * the estimation vector size should not be zero
  //  * the estimation vector size should equal ground truth vector size

  if(estimations.size() != ground_truth.size() || estimations.size() == 0){
    std::cerr << "Invalid estimation or ground_truth data" << std::endl;
    return rmse;
  }

  //accumulate squared residuals
  for(unsigned int i=0; i < estimations.size(); ++i){
    VectorXd residual = estimations[i] - ground_truth[i];
    //coefficient-wise multiplication
    residual = residual.array()*residual.array();
    rmse += residual;
  }

  // calculate sqrt of mean
  rmse = rmse/estimations.size();
  rmse = rmse.array().sqrt();
  return rmse;
}